

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_0::UniformValueArrayCase::test(UniformValueArrayCase *this)

{
  CallLogWrapper *this_00;
  TestContext *pTVar1;
  GLuint shader;
  GLuint shader_00;
  GLuint program;
  GLint GVar2;
  long lVar3;
  undefined8 *puVar4;
  GLfloat *pGVar5;
  byte bVar6;
  float uniformValue [20];
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  
  bVar6 = 0;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  shader_00 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  glu::CallLogWrapper::glShaderSource(this_00,shader,1,&test::testVertSource,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource(this_00,shader_00,1,&test::testFragSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,shader);
  glu::CallLogWrapper::glCompileShader(this_00,shader_00);
  ApiCase::expectError(&this->super_ApiCase,0);
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  glu::CallLogWrapper::glAttachShader(this_00,program,shader);
  glu::CallLogWrapper::glAttachShader(this_00,program,shader_00);
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  puVar4 = &DAT_01c5cab0;
  pGVar5 = &local_88;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)pGVar5 = *puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    pGVar5 = pGVar5 + (ulong)bVar6 * -4 + 2;
  }
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"arrayUniform");
  glu::CallLogWrapper::glUniform1fv(this_00,GVar2,5,&local_88);
  ApiCase::expectError(&this->super_ApiCase,0);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"arrayUniform[0]");
  verifyUniformValue1f(pTVar1,this_00,program,GVar2,local_88);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"arrayUniform[1]");
  verifyUniformValue1f(pTVar1,this_00,program,GVar2,local_84);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"arrayUniform[2]");
  verifyUniformValue1f(pTVar1,this_00,program,GVar2,local_80);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"arrayUniform[3]");
  verifyUniformValue1f(pTVar1,this_00,program,GVar2,local_7c);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"arrayUniform[4]");
  verifyUniformValue1f(pTVar1,this_00,program,GVar2,local_78);
  ApiCase::expectError(&this->super_ApiCase,0);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"array2Uniform");
  glu::CallLogWrapper::glUniform2fv(this_00,GVar2,5,&local_88);
  ApiCase::expectError(&this->super_ApiCase,0);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"array2Uniform[0]");
  verifyUniformValue2f(pTVar1,this_00,program,GVar2,local_88,local_84);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"array2Uniform[1]");
  verifyUniformValue2f(pTVar1,this_00,program,GVar2,local_80,local_7c);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"array2Uniform[2]");
  verifyUniformValue2f(pTVar1,this_00,program,GVar2,local_78,local_74);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"array2Uniform[3]");
  verifyUniformValue2f(pTVar1,this_00,program,GVar2,local_70,local_6c);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"array2Uniform[4]");
  verifyUniformValue2f(pTVar1,this_00,program,GVar2,local_68,local_64);
  ApiCase::expectError(&this->super_ApiCase,0);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"array3Uniform");
  glu::CallLogWrapper::glUniform3fv(this_00,GVar2,5,&local_88);
  ApiCase::expectError(&this->super_ApiCase,0);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"array3Uniform[0]");
  verifyUniformValue3f(pTVar1,this_00,program,GVar2,local_88,local_84,local_80);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"array3Uniform[1]");
  verifyUniformValue3f(pTVar1,this_00,program,GVar2,local_7c,local_78,local_74);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"array3Uniform[2]");
  verifyUniformValue3f(pTVar1,this_00,program,GVar2,local_70,local_6c,local_68);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"array3Uniform[3]");
  verifyUniformValue3f(pTVar1,this_00,program,GVar2,local_64,local_60,local_5c);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"array3Uniform[4]");
  verifyUniformValue3f(pTVar1,this_00,program,GVar2,local_58,local_54,local_50);
  ApiCase::expectError(&this->super_ApiCase,0);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"array4Uniform");
  glu::CallLogWrapper::glUniform4fv(this_00,GVar2,5,&local_88);
  ApiCase::expectError(&this->super_ApiCase,0);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"array4Uniform[0]");
  verifyUniformValue4f(pTVar1,this_00,program,GVar2,local_88,local_84,local_80,local_7c);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"array4Uniform[1]");
  verifyUniformValue4f(pTVar1,this_00,program,GVar2,local_78,local_74,local_70,local_6c);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"array4Uniform[2]");
  verifyUniformValue4f(pTVar1,this_00,program,GVar2,local_68,local_64,local_60,local_5c);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"array4Uniform[3]");
  verifyUniformValue4f(pTVar1,this_00,program,GVar2,local_58,local_54,local_50,local_4c);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"array4Uniform[4]");
  verifyUniformValue4f(pTVar1,this_00,program,GVar2,local_48,local_44,local_40,local_3c);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteShader(this_00,shader);
  glu::CallLogWrapper::glDeleteShader(this_00,shader_00);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		static const char* testVertSource =
			"#version 300 es\n"
			"uniform highp float arrayUniform[5];"
			"uniform highp vec2 array2Uniform[5];"
			"uniform highp vec3 array3Uniform[5];"
			"uniform highp vec4 array4Uniform[5];"
			"void main (void)\n"
			"{\n"
			"	gl_Position = \n"
			"		+ vec4(arrayUniform[0]		+ arrayUniform[1]		+ arrayUniform[2]		+ arrayUniform[3]		+ arrayUniform[4])\n"
			"		+ vec4(array2Uniform[0].x	+ array2Uniform[1].x	+ array2Uniform[2].x	+ array2Uniform[3].x	+ array2Uniform[4].x)\n"
			"		+ vec4(array3Uniform[0].x	+ array3Uniform[1].x	+ array3Uniform[2].x	+ array3Uniform[3].x	+ array3Uniform[4].x)\n"
			"		+ vec4(array4Uniform[0].x	+ array4Uniform[1].x	+ array4Uniform[2].x	+ array4Uniform[3].x	+ array4Uniform[4].x);\n"
			"}\n";
		static const char* testFragSource =
			"#version 300 es\n"
			"layout(location = 0) out mediump vec4 fragColor;"
			"void main (void)\n"
			"{\n"
			"	fragColor = vec4(0.0);\n"
			"}\n";

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		glShaderSource(shaderVert, 1, &testVertSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &testFragSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		GLuint program = glCreateProgram();
		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);
		glLinkProgram(program);
		glUseProgram(program);
		expectError(GL_NO_ERROR);

		GLint location;

		float uniformValue[5 * 4] =
		{
			-1.0f,	0.1f,	4.0f,	800.0f,
			13.0f,	55.0f,	12.0f,	91.0f,
			-55.1f,	1.1f,	98.0f,	19.0f,
			41.0f,	65.0f,	4.0f,	12.2f,
			95.0f,	77.0f,	32.0f,	48.0f
		};

		location = glGetUniformLocation(program,"arrayUniform");
		glUniform1fv(location, 5, uniformValue);
		expectError(GL_NO_ERROR);

		verifyUniformValue1f(m_testCtx, *this, program, glGetUniformLocation(program,"arrayUniform[0]"), uniformValue[0]);
		verifyUniformValue1f(m_testCtx, *this, program, glGetUniformLocation(program,"arrayUniform[1]"), uniformValue[1]);
		verifyUniformValue1f(m_testCtx, *this, program, glGetUniformLocation(program,"arrayUniform[2]"), uniformValue[2]);
		verifyUniformValue1f(m_testCtx, *this, program, glGetUniformLocation(program,"arrayUniform[3]"), uniformValue[3]);
		verifyUniformValue1f(m_testCtx, *this, program, glGetUniformLocation(program,"arrayUniform[4]"), uniformValue[4]);
		expectError(GL_NO_ERROR);

		location = glGetUniformLocation(program,"array2Uniform");
		glUniform2fv(location, 5, uniformValue);
		expectError(GL_NO_ERROR);

		verifyUniformValue2f(m_testCtx, *this, program, glGetUniformLocation(program,"array2Uniform[0]"), uniformValue[2 * 0], uniformValue[(2 * 0) + 1]);
		verifyUniformValue2f(m_testCtx, *this, program, glGetUniformLocation(program,"array2Uniform[1]"), uniformValue[2 * 1], uniformValue[(2 * 1) + 1]);
		verifyUniformValue2f(m_testCtx, *this, program, glGetUniformLocation(program,"array2Uniform[2]"), uniformValue[2 * 2], uniformValue[(2 * 2) + 1]);
		verifyUniformValue2f(m_testCtx, *this, program, glGetUniformLocation(program,"array2Uniform[3]"), uniformValue[2 * 3], uniformValue[(2 * 3) + 1]);
		verifyUniformValue2f(m_testCtx, *this, program, glGetUniformLocation(program,"array2Uniform[4]"), uniformValue[2 * 4], uniformValue[(2 * 4) + 1]);
		expectError(GL_NO_ERROR);

		location = glGetUniformLocation(program,"array3Uniform");
		glUniform3fv(location, 5, uniformValue);
		expectError(GL_NO_ERROR);

		verifyUniformValue3f(m_testCtx, *this, program, glGetUniformLocation(program,"array3Uniform[0]"), uniformValue[3 * 0], uniformValue[(3 * 0) + 1], uniformValue[(3 * 0) + 2]);
		verifyUniformValue3f(m_testCtx, *this, program, glGetUniformLocation(program,"array3Uniform[1]"), uniformValue[3 * 1], uniformValue[(3 * 1) + 1], uniformValue[(3 * 1) + 2]);
		verifyUniformValue3f(m_testCtx, *this, program, glGetUniformLocation(program,"array3Uniform[2]"), uniformValue[3 * 2], uniformValue[(3 * 2) + 1], uniformValue[(3 * 2) + 2]);
		verifyUniformValue3f(m_testCtx, *this, program, glGetUniformLocation(program,"array3Uniform[3]"), uniformValue[3 * 3], uniformValue[(3 * 3) + 1], uniformValue[(3 * 3) + 2]);
		verifyUniformValue3f(m_testCtx, *this, program, glGetUniformLocation(program,"array3Uniform[4]"), uniformValue[3 * 4], uniformValue[(3 * 4) + 1], uniformValue[(3 * 4) + 2]);
		expectError(GL_NO_ERROR);

		location = glGetUniformLocation(program,"array4Uniform");
		glUniform4fv(location, 5, uniformValue);
		expectError(GL_NO_ERROR);

		verifyUniformValue4f(m_testCtx, *this, program, glGetUniformLocation(program,"array4Uniform[0]"), uniformValue[4 * 0], uniformValue[(4 * 0) + 1], uniformValue[(4 * 0) + 2], uniformValue[(4 * 0) + 3]);
		verifyUniformValue4f(m_testCtx, *this, program, glGetUniformLocation(program,"array4Uniform[1]"), uniformValue[4 * 1], uniformValue[(4 * 1) + 1], uniformValue[(4 * 1) + 2], uniformValue[(4 * 1) + 3]);
		verifyUniformValue4f(m_testCtx, *this, program, glGetUniformLocation(program,"array4Uniform[2]"), uniformValue[4 * 2], uniformValue[(4 * 2) + 1], uniformValue[(4 * 2) + 2], uniformValue[(4 * 2) + 3]);
		verifyUniformValue4f(m_testCtx, *this, program, glGetUniformLocation(program,"array4Uniform[3]"), uniformValue[4 * 3], uniformValue[(4 * 3) + 1], uniformValue[(4 * 3) + 2], uniformValue[(4 * 3) + 3]);
		verifyUniformValue4f(m_testCtx, *this, program, glGetUniformLocation(program,"array4Uniform[4]"), uniformValue[4 * 4], uniformValue[(4 * 4) + 1], uniformValue[(4 * 4) + 2], uniformValue[(4 * 4) + 3]);
		expectError(GL_NO_ERROR);

		glUseProgram(0);
		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}